

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O2

void aom_yv12_partial_copy_u_c
               (YV12_BUFFER_CONFIG *src_bc,int hstart1,int hend1,int vstart1,int vend1,
               YV12_BUFFER_CONFIG *dst_bc,int hstart2,int vstart2)

{
  uint8_t *__dest;
  void *__dest_00;
  uint8_t *__src;
  void *__src_00;
  
  __src = (src_bc->field_5).buffers[1] +
          (long)hstart1 + (long)vstart1 * (long)(src_bc->field_4).field_0.uv_stride;
  if ((src_bc->flags & 8) == 0) {
    __dest = (dst_bc->field_5).buffers[1] +
             (long)vstart2 * (long)(dst_bc->field_4).field_0.uv_stride + (long)hstart2;
    for (; vstart1 < vend1; vstart1 = vstart1 + 1) {
      memcpy(__dest,__src,(long)(hend1 - hstart1));
      __src = __src + (src_bc->field_4).field_0.uv_stride;
      __dest = __dest + (dst_bc->field_4).field_0.uv_stride;
    }
  }
  else {
    __src_00 = (void *)((long)__src * 2);
    __dest_00 = (void *)((long)((dst_bc->field_5).buffers[1] +
                               (long)vstart2 * (long)(dst_bc->field_4).field_0.uv_stride +
                               (long)hstart2) * 2);
    for (; vstart1 < vend1; vstart1 = vstart1 + 1) {
      memcpy(__dest_00,__src_00,(long)(hend1 - hstart1) * 2);
      __src_00 = (void *)((long)__src_00 + (long)(src_bc->field_4).field_0.uv_stride * 2);
      __dest_00 = (void *)((long)__dest_00 + (long)(dst_bc->field_4).field_0.uv_stride * 2);
    }
  }
  return;
}

Assistant:

void aom_yv12_partial_copy_u_c(const YV12_BUFFER_CONFIG *src_bc, int hstart1,
                               int hend1, int vstart1, int vend1,
                               YV12_BUFFER_CONFIG *dst_bc, int hstart2,
                               int vstart2) {
  int row;
  const uint8_t *src = src_bc->u_buffer;
  uint8_t *dst = dst_bc->u_buffer;
#if CONFIG_AV1_HIGHBITDEPTH
  if (src_bc->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *src16 =
        CONVERT_TO_SHORTPTR(src + vstart1 * src_bc->uv_stride + hstart1);
    uint16_t *dst16 =
        CONVERT_TO_SHORTPTR(dst + vstart2 * dst_bc->uv_stride + hstart2);
    for (row = vstart1; row < vend1; ++row) {
      memcpy(dst16, src16, (hend1 - hstart1) * sizeof(uint16_t));
      src16 += src_bc->uv_stride;
      dst16 += dst_bc->uv_stride;
    }
    return;
  }
#endif
  src = (src + vstart1 * src_bc->uv_stride + hstart1);
  dst = (dst + vstart2 * dst_bc->uv_stride + hstart2);

  for (row = vstart1; row < vend1; ++row) {
    memcpy(dst, src, (hend1 - hstart1));
    src += src_bc->uv_stride;
    dst += dst_bc->uv_stride;
  }
}